

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SimpleDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleDirectiveSyntax,slang::syntax::SimpleDirectiveSyntax_const&>
          (BumpAllocator *this,SimpleDirectiveSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SimpleDirectiveSyntax *pSVar8;
  
  pSVar8 = (SimpleDirectiveSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->super_DirectiveSyntax).directive.kind;
  uVar5 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar6.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar7 = (args->super_DirectiveSyntax).directive.rawLen;
  (pSVar8->super_DirectiveSyntax).super_SyntaxNode.kind =
       (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pSVar8->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  (pSVar8->super_DirectiveSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pSVar8->super_DirectiveSyntax).directive.kind = TVar4;
  (pSVar8->super_DirectiveSyntax).directive.field_0x2 = uVar5;
  (pSVar8->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->super_DirectiveSyntax).directive.rawLen = uVar7;
  (pSVar8->super_DirectiveSyntax).directive.info = (args->super_DirectiveSyntax).directive.info;
  return pSVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }